

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createQuads<deqp::gls::GLValue::WrappedType<signed_char>>
                 (int seed,int count,int componentCount,int offset,int stride,Primitive primitive,
                 WrappedType<signed_char> min,WrappedType<signed_char> max,float gridSize)

{
  uint uVar1;
  uint uVar2;
  char cVar3;
  Byte min_00;
  Byte BVar4;
  Byte BVar5;
  int iVar6;
  char *pcVar7;
  byte bVar8;
  char cVar9;
  ulong uVar10;
  char cVar11;
  int iVar12;
  byte bVar13;
  char cVar14;
  char cVar16;
  int iVar17;
  int iVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  ushort uVar24;
  bool bVar25;
  uint uVar26;
  uint uVar27;
  float fVar28;
  deRandom rnd;
  uint uVar15;
  
  uVar21 = (ulong)(uint)stride;
  if (stride == 0) {
    stride = componentCount;
  }
  iVar6 = stride * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    iVar6 = 0;
  }
  pcVar7 = (char *)operator_new__((long)(iVar6 * count + offset));
  deRandom_init(&rnd,seed);
  if (primitive == PRIMITIVE_TRIANGLES) {
    fVar28 = (float)(int)max.m_value - (float)(int)min.m_value;
    uVar26 = -(uint)(-fVar28 <= fVar28);
    min_00.m_value =
         (char)(int)((float)(~uVar26 & (uint)-fVar28 | (uint)fVar28 & uVar26) * gridSize);
    cVar9 = '\x04';
    if (min_00.m_value < '\x05') {
      min_00.m_value = '\x04';
    }
    uVar26 = stride * 5;
    uVar22 = 0;
    uVar23 = (ulong)(uint)count;
    if (count < 1) {
      uVar23 = 0;
    }
    iVar17 = 2;
    iVar18 = 3;
    uVar10 = uVar23;
    uVar15 = offset;
    uVar2 = uVar26;
    uVar1 = uVar26;
    for (; uVar22 != uVar23; uVar22 = uVar22 + 1) {
      iVar12 = 4;
      do {
        bVar25 = iVar12 == 0;
        iVar12 = iVar12 + -1;
        if (bVar25) break;
        BVar4 = getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                          (&rnd,min.m_value,max.m_value);
        uVar24 = (ushort)(byte)min_00.m_value;
        bVar8 = BVar4.m_value - (char)((short)BVar4.m_value % (short)uVar24);
        uVar1 = (uint)bVar8;
        BVar4 = getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                          (&rnd,min_00,(Byte)(max.m_value - bVar8 & 0x7f));
        bVar8 = BVar4.m_value - (char)((short)BVar4.m_value % (short)uVar24);
        uVar10 = (ulong)bVar8;
        BVar4 = getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                          (&rnd,min.m_value,max.m_value);
        bVar13 = BVar4.m_value - (char)((short)BVar4.m_value % (short)uVar24);
        uVar15 = (uint)bVar13;
        BVar4 = getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                          (&rnd,min_00,(Byte)(max.m_value - bVar13 & 0x7f));
        bVar13 = BVar4.m_value - (char)((short)BVar4.m_value % (short)uVar24);
        uVar2 = (uint)bVar13;
        if (componentCount < 3) {
          uVar21 = 0;
          cVar9 = '\x01';
          break;
        }
        BVar4 = getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                          (&rnd,min.m_value,max.m_value);
        cVar9 = '\x01';
        if (componentCount != 3) {
          BVar5 = getRandom<deqp::gls::GLValue::WrappedType<signed_char>>
                            (&rnd,min.m_value,max.m_value);
          cVar9 = BVar5.m_value - (char)((short)BVar5.m_value % (short)uVar24);
        }
        bVar20 = BVar4.m_value - (char)((short)BVar4.m_value % (short)uVar24);
        uVar21 = (ulong)bVar20;
        fVar28 = (float)(int)(char)bVar20 + (float)(int)(char)bVar8;
        uVar27 = -(uint)(-fVar28 <= fVar28);
      } while (((float)(~uVar27 & (uint)-fVar28 | (uint)fVar28 & uVar27) <
                (float)(int)min_00.m_value) ||
              (fVar28 = (float)(int)cVar9 + (float)(int)(char)bVar13,
              uVar27 = -(uint)(-fVar28 <= fVar28),
              (float)(~uVar27 & (uint)-fVar28 | (uint)fVar28 & uVar27) < (float)(int)min_00.m_value)
              );
      iVar12 = iVar6 * (int)uVar22;
      cVar3 = (char)uVar1;
      cVar11 = cVar3 + (char)uVar10;
      pcVar7[(long)iVar12 + (long)offset] = cVar3;
      cVar14 = (char)uVar15;
      pcVar7[(long)iVar12 + (long)offset + 1] = cVar14;
      pcVar7[(long)(iVar12 + stride) + (long)offset] = cVar11;
      pcVar7[(long)(iVar12 + 1 + stride) + (long)offset] = cVar14;
      cVar16 = cVar14 + (char)uVar2;
      lVar19 = (long)(stride * 2 + iVar12);
      pcVar7[lVar19 + offset] = cVar3;
      pcVar7[lVar19 + (long)offset + 1] = cVar16;
      pcVar7[(long)(iVar12 + stride * 3) + (long)offset] = cVar3;
      pcVar7[(long)(iVar12 + 1 + stride * 3) + (long)offset] = cVar16;
      lVar19 = (long)(iVar12 + stride * 4);
      pcVar7[lVar19 + offset] = cVar11;
      pcVar7[lVar19 + (long)offset + 1] = cVar14;
      pcVar7[(long)(int)(iVar12 + uVar26) + (long)offset] = cVar11;
      uVar21 = uVar21 & 0xffffffff;
      pcVar7[(long)(int)(iVar12 + 1 + uVar26) + (long)offset] = cVar16;
      if (2 < componentCount) {
        lVar19 = 6;
        iVar12 = iVar17;
        while (bVar25 = lVar19 != 0, lVar19 = lVar19 + -1, bVar25) {
          pcVar7[(long)iVar12 + (long)offset] = (char)uVar21;
          iVar12 = iVar12 + stride;
        }
        if (componentCount != 3) {
          lVar19 = 6;
          iVar12 = iVar18;
          while (bVar25 = lVar19 != 0, lVar19 = lVar19 + -1, bVar25) {
            pcVar7[(long)iVar12 + (long)offset] = cVar9;
            iVar12 = iVar12 + stride;
          }
        }
      }
      iVar17 = iVar17 + iVar6;
      iVar18 = iVar18 + iVar6;
    }
  }
  return pcVar7;
}

Assistant:

char* RandomArrayGenerator::createQuads (int seed, int count, int componentCount, int offset, int stride, Array::Primitive primitive, T min, T max, float gridSize)
{
	int componentStride = sizeof(T);
	int quadStride = 0;

	if (stride == 0)
		stride = componentCount * componentStride;

	DE_ASSERT(stride >= componentCount * componentStride);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* resultData = new char[offset + quadStride * count];
	char* _data = resultData;
	resultData = resultData + offset;

	deRandom rnd;
	deRandom_init(&rnd,  seed);

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
		{
			const T	minQuadSize	= T::fromFloat(deFloatAbs(max.template to<float>() - min.template to<float>()) * gridSize);
			const T	minDiff		= minValue<T>() > minQuadSize
								? minValue<T>()
								: minQuadSize;

			for (int quadNdx = 0; quadNdx < count; ++quadNdx)
			{
				T x1, x2;
				T y1, y2;
				T z, w;

				// attempt to find a good (i.e not extremely small) quad
				for (int attemptNdx = 0; attemptNdx < 4; ++attemptNdx)
				{
					x1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					x2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - x1)));

					y1 = roundTo(minDiff, getRandom<T>(rnd, min, max));
					y2 = roundTo(minDiff, getRandom<T>(rnd, minDiff, abs<T>(max - y1)));

					z = (componentCount > 2) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(0));
					w = (componentCount > 3) ? roundTo(minDiff, (getRandom<T>(rnd, min, max))) : (T::create(1));

					// no additional components, all is good
					if (componentCount <= 2)
						break;

					// The result quad is too thin?
					if ((deFloatAbs(x2.template to<float>() + z.template to<float>()) < minDiff.template to<float>()) ||
						(deFloatAbs(y2.template to<float>() + w.template to<float>()) < minDiff.template to<float>()))
						continue;

					// all ok
					break;
				}

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 2 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3]), x1);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 3 + componentStride]), y1 + y2);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 4 + componentStride]), y1);

				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5]), x1 + x2);
				alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * 5 + componentStride]), y1 + y2);

				if (componentCount > 2)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 2]), z);
				}

				if (componentCount > 3)
				{
					for (int i = 0; i < 6; i++)
						alignmentSafeAssignment<T>(&(resultData[quadNdx * quadStride + stride * i + componentStride * 3]), w);
				}
			}

			break;
		}

		default:
			DE_ASSERT(false);
			break;
	}

	return _data;
}